

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::(anonymous_namespace)::LayeredImage::setPixel<tcu::Vector<unsigned_int,4>>
          (LayeredImage *this,int x,int y,int z,Vector<unsigned_int,_4> *color)

{
  CubeFace face;
  Texture1D *this_00;
  PixelBufferAccess *pPVar1;
  Texture2D *this_01;
  TextureCube *this_02;
  Texture3D *this_03;
  Texture2DArray *this_04;
  int local_74;
  undefined1 local_50 [8];
  PixelBufferAccess access;
  Vector<unsigned_int,_4> *color_local;
  int z_local;
  int y_local;
  int x_local;
  LayeredImage *this_local;
  
  access.super_ConstPixelBufferAccess.m_data = color;
  if (*(int *)this == 7) {
    this_00 = de::SharedPtr<tcu::Texture1D>::operator->((SharedPtr<tcu::Texture1D> *)(this + 0x18));
    pPVar1 = tcu::TextureLevelPyramid::getLevel(&this_00->super_TextureLevelPyramid,0);
    tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)local_50,pPVar1);
  }
  else if (*(int *)this == 0) {
    this_01 = de::SharedPtr<tcu::Texture2D>::operator->((SharedPtr<tcu::Texture2D> *)(this + 0x28));
    pPVar1 = tcu::TextureLevelPyramid::getLevel(&this_01->super_TextureLevelPyramid,0);
    tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)local_50,pPVar1);
  }
  else if (*(int *)this == 1) {
    this_02 = de::SharedPtr<tcu::TextureCube>::operator->
                        ((SharedPtr<tcu::TextureCube> *)(this + 0x38));
    face = anon_unknown_1::glslImageFuncZToCubeFace(z);
    pPVar1 = tcu::TextureCube::getLevelFace(this_02,0,face);
    tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)local_50,pPVar1);
  }
  else if (*(int *)this == 3) {
    this_03 = de::SharedPtr<tcu::Texture3D>::operator->((SharedPtr<tcu::Texture3D> *)(this + 0x48));
    pPVar1 = tcu::TextureLevelPyramid::getLevel(&this_03->super_TextureLevelPyramid,0);
    tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)local_50,pPVar1);
  }
  else if (*(int *)this == 2) {
    this_04 = de::SharedPtr<tcu::Texture2DArray>::operator->
                        ((SharedPtr<tcu::Texture2DArray> *)(this + 0x58));
    pPVar1 = tcu::TextureLevelPyramid::getLevel(&this_04->super_TextureLevelPyramid,0);
    tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)local_50,pPVar1);
  }
  else {
    tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)local_50);
  }
  local_74 = z;
  if (*(int *)this == 1) {
    local_74 = 0;
  }
  tcu::PixelBufferAccess::setPixel
            ((PixelBufferAccess *)local_50,(UVec4 *)access.super_ConstPixelBufferAccess.m_data,x,y,
             local_74);
  return;
}

Assistant:

void LayeredImage::setPixel (int x, int y, int z, const ColorT& color) const
{
	const PixelBufferAccess access = m_type == TEXTURETYPE_BUFFER		? m_texBuffer->getLevel(0)
								   : m_type == TEXTURETYPE_2D			? m_tex2D->getLevel(0)
								   : m_type == TEXTURETYPE_CUBE			? m_texCube->getLevelFace(0, glslImageFuncZToCubeFace(z))
								   : m_type == TEXTURETYPE_3D			? m_tex3D->getLevel(0)
								   : m_type == TEXTURETYPE_2D_ARRAY		? m_tex2DArray->getLevel(0)
								   : PixelBufferAccess();

	access.setPixel(color, x, y, m_type == TEXTURETYPE_CUBE ? 0 : z);
}